

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MegaBoy.hpp
# Opt level: O2

void __thiscall
Atari2600::Cartridge::MegaBoy::perform_bus_operation
          (MegaBoy *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  byte bVar1;
  
  if (0xfff < (address & 0x1fff)) {
    if ((address & 0x1fff) == 0x1ff0) {
      bVar1 = this->current_page_ + 1 & 0xf;
      this->current_page_ = bVar1;
      this->rom_ptr_ = (this->super_BusExtender).rom_base_ + (ulong)bVar1 * 0x1000;
    }
    if ((int)operation < 5) {
      *value = this->rom_ptr_[address & 0xfff];
    }
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address == 0x1ff0) {
				current_page_ = (current_page_ + 1) & 15;
				rom_ptr_ = rom_base_ + current_page_ * 4096;
			}

			if(isReadOperation(operation)) {
				*value = rom_ptr_[address & 4095];
			}
		}